

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uras.c
# Opt level: O1

void compute_deriv(qnode_ptr_t c,qnode_ptr_t f)

{
  int z;
  uint uVar1;
  uint uVar2;
  float *pfVar3;
  qnode_ptr_t q;
  int iVar4;
  long lVar5;
  uint x;
  int iVar6;
  long lVar7;
  float fVar8;
  uint local_54;
  
  x = f->ofst;
  uVar1 = f->sizy - x;
  q = f;
  uVar2 = x;
  if ((int)x < (int)uVar1) {
    do {
      for (; (int)x < f->sizx - f->ofst; x = x + 1) {
        if (0 < f->sizz) {
          lVar5 = 0;
          do {
            fVar8 = dx(c,f,uVar2,x,(int)lVar5);
            (*f->param_ptr[lVar5])[(int)(f->res * uVar2 + x)].fx = fVar8;
            q = f;
            fVar8 = dy(c,f,uVar2,x,(int)lVar5);
            (*f->param_ptr[lVar5])[(int)(f->res * uVar2 + x)].fy = fVar8;
            lVar5 = lVar5 + 1;
          } while (lVar5 < f->sizz);
        }
      }
      uVar2 = uVar2 + 1;
      x = f->ofst;
      uVar1 = f->sizy - x;
    } while ((int)uVar2 < (int)uVar1);
  }
  z = (int)((double)c->sizz * 0.5);
  if ((int)x < (int)uVar1) {
    iVar6 = f->sizx;
    local_54 = x;
    do {
      if ((int)x < (int)(iVar6 - x)) {
        pfVar3 = &(*f->param_ptr[z])[(long)(int)local_54 * (long)f->res + (long)(int)x].ft;
        iVar4 = iVar6 + x * -2;
        uVar2 = x;
        do {
          if (pfVar3[8] == 0.0) {
            fVar8 = dt(c,q,local_54,uVar2);
            *pfVar3 = fVar8;
            fVar8 = dxt(f,local_54,uVar2);
            pfVar3[1] = fVar8;
            q = (qnode_ptr_t)(ulong)local_54;
            fVar8 = dyt(f,local_54,uVar2);
            pfVar3[2] = fVar8;
          }
          uVar2 = uVar2 + 1;
          pfVar3 = pfVar3 + 0xc;
          iVar4 = iVar4 + -1;
        } while (iVar4 != 0);
      }
      local_54 = local_54 + 1;
    } while (local_54 != uVar1);
  }
  iVar6 = f->ofst;
  if ((int)x < f->sizy - iVar6) {
    do {
      if (iVar6 < f->sizx - f->ofst) {
        lVar7 = (long)iVar6;
        lVar5 = (long)(int)x;
        do {
          if ((*f->param_ptr[z])[f->res * lVar5 + lVar7].err == 0) {
            iVar6 = (int)lVar7;
            fVar8 = dxx(f,x,iVar6,z);
            (*f->param_ptr[z])[f->res * lVar5 + lVar7].fxx = fVar8;
            fVar8 = dyy(f,x,iVar6,z);
            (*f->param_ptr[z])[f->res * lVar5 + lVar7].fyy = fVar8;
            fVar8 = dxy(f,x,iVar6,z);
            (*f->param_ptr[z])[f->res * lVar5 + lVar7].fxy = fVar8;
          }
          lVar7 = lVar7 + 1;
        } while ((int)lVar7 < f->sizx - f->ofst);
      }
      x = x + 1;
      iVar6 = f->ofst;
    } while ((int)x < f->sizy - iVar6);
  }
  return;
}

Assistant:

void compute_deriv(c,f)
qnode_ptr_t c, f ;

{ float dxx(), dyy(), dxy(), dx(), dy(), dt(), dxt(), dyt() ;
  int i, j, k ;
param_t P ;
  for (i = f->ofst ; i < f->sizy - f->ofst ; i++) {
    for (j = f->ofst ; j < f->sizx - f->ofst ; j++) {
      for (k = 0 ; k < f->sizz ; k++) {
        (*f->param_ptr[k])[f->res*i + j].fx = dx(c,f,i,j,k) ;
        (*f->param_ptr[k])[f->res*i + j].fy = dy(c,f,i,j,k) ;
      }
    }
  }
  k = c->sizz/2.0 ;
  for (i = f->ofst ; i < f->sizy - f->ofst ; i++) {
    for (j = f->ofst ; j < f->sizx - f->ofst ; j++) {
      if ((*f->param_ptr[k])[f->res*i + j].err == NO_ERROR) {
        (*f->param_ptr[k])[f->res*i + j].ft = dt(c,f,i,j) ;
        (*f->param_ptr[k])[f->res*i + j].fxt = dxt(f,i,j) ;
        (*f->param_ptr[k])[f->res*i + j].fyt = dyt(f,i,j) ;
      }
    }
  }
  for (i = f->ofst ; i < f->sizy - f->ofst ; i++) {
    for (j = f->ofst ; j < f->sizx - f->ofst ; j++) {
      if ((*f->param_ptr[k])[f->res*i + j].err == NO_ERROR) {
        (*f->param_ptr[k])[f->res*i + j].fxx = dxx(f,i,j,k) ;
        (*f->param_ptr[k])[f->res*i + j].fyy = dyy(f,i,j,k) ;
        (*f->param_ptr[k])[f->res*i + j].fxy = dxy(f,i,j,k) ;
      }
    }
  }
}